

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)

{
  xmlElementType nodeType;
  xmlChar *localName;
  int iVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  char *pcVar4;
  char *pcVar5;
  int *in_R9;
  xmlSchemaNodeInfoPtr pxVar6;
  xmlNodePtr pxVar7;
  xmlChar *nsName;
  _xmlNode *p_Var8;
  xmlChar *in_stack_ffffffffffffffb8;
  
  iVar1 = xmlSchemaPreRun(vctxt);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    if (vctxt->doc == (xmlDoc *)0x0) {
      iVar1 = 0;
      if (vctxt->reader == (xmlTextReaderPtr)0x0) {
        if ((vctxt->sax == (xmlSAXHandlerPtr)0x0) || (vctxt->parserCtxt == (xmlParserCtxtPtr)0x0)) {
          pcVar5 = "xmlSchemaVStart";
          pcVar4 = "no instance to validate";
LAB_001a8c05:
          xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,pcVar5,pcVar4);
          iVar1 = -1;
        }
        else {
          iVar1 = xmlParseDocument(vctxt->parserCtxt);
        }
      }
    }
    else {
      pxVar3 = vctxt->validationRoot;
      if ((pxVar3 == (xmlNodePtr)0x0) &&
         (pxVar3 = xmlDocGetRootElement(vctxt->doc), pxVar3 == (xmlNodePtr)0x0)) {
        iVar1 = 1;
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_ERR_INTERNAL_ERROR,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)0x0,"The document has no document element",
                           (xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        vctxt->depth = -1;
        vctxt->validationRoot = pxVar3;
        pxVar6 = (xmlSchemaNodeInfoPtr)0x0;
        pxVar7 = pxVar3;
LAB_001a89b8:
        p_Var8 = pxVar7;
        iVar1 = -1;
        if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) goto LAB_001a8b75;
        nodeType = p_Var8->type;
        if (1 < nodeType - XML_TEXT_NODE) {
          if (nodeType == XML_ELEMENT_NODE) {
            vctxt->depth = vctxt->depth + 1;
            iVar2 = xmlSchemaValidatorPushElem(vctxt);
            if (iVar2 == -1) goto LAB_001a8c55;
            pxVar6 = vctxt->inode;
            pxVar6->node = p_Var8;
            pxVar6->nodeLine = (uint)p_Var8->line;
            pxVar6->localName = p_Var8->name;
            if (p_Var8->ns != (xmlNs *)0x0) {
              pxVar6->nsName = p_Var8->ns->href;
            }
            *(byte *)&pxVar6->flags = (byte)pxVar6->flags | 0x20;
            vctxt->nbAttrInfos = 0;
            for (pxVar7 = (xmlNodePtr)p_Var8->properties; pxVar7 != (xmlNodePtr)0x0;
                pxVar7 = pxVar7->next) {
              if (pxVar7->ns == (xmlNs *)0x0) {
                nsName = (xmlChar *)0x0;
              }
              else {
                nsName = pxVar7->ns->href;
              }
              iVar1 = pxVar6->nodeLine;
              localName = pxVar7->name;
              in_R9 = (int *)xmlNodeListGetString(pxVar7->doc,pxVar7->children,1);
              iVar1 = xmlSchemaValidatorPushAttribute
                                (vctxt,pxVar7,iVar1,localName,nsName,(int)in_R9,
                                 in_stack_ffffffffffffffb8,(int)pxVar6);
              if (iVar1 == -1) {
                pcVar5 = "xmlSchemaDocWalk";
                pcVar4 = "calling xmlSchemaValidatorPushAttribute()";
                goto LAB_001a8c05;
              }
            }
            iVar1 = xmlSchemaValidateElem(vctxt);
            if (iVar1 == 0) {
              if ((vctxt->skipDepth == -1) || (vctxt->depth < vctxt->skipDepth)) goto LAB_001a8a26;
              goto LAB_001a8b48;
            }
            if (iVar1 == -1) {
              pcVar5 = "xmlSchemaDocWalk";
              pcVar4 = "calling xmlSchemaValidateElem()";
              goto LAB_001a8c4d;
            }
          }
          else if (nodeType - XML_ENTITY_REF_NODE < 2) {
            pcVar5 = "xmlSchemaVDocWalk";
            pcVar4 = 
            "there is at least one entity reference in the node-tree currently being validated. Processing of entities with this XML Schema processor is not supported (yet). Please substitute entities before validation."
            ;
            goto LAB_001a8c4d;
          }
          goto LAB_001a8b48;
        }
        if ((pxVar6 != (xmlSchemaNodeInfoPtr)0x0) && ((pxVar6->flags & 0x20U) != 0)) {
          pxVar6->flags = pxVar6->flags & 0xffffffdf;
        }
        iVar1 = xmlSchemaVPushText(vctxt,nodeType,p_Var8->content,-1,1,in_R9);
        if (-1 < iVar1) goto LAB_001a8a26;
        pcVar5 = "xmlSchemaVDocWalk";
        pcVar4 = "calling xmlSchemaVPushText()";
LAB_001a8c4d:
        iVar1 = -1;
        xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,pcVar5,pcVar4);
      }
    }
LAB_001a8c55:
    xmlSchemaPostRun(vctxt);
    if (iVar1 == 0) {
      iVar1 = vctxt->err;
    }
  }
  return iVar1;
LAB_001a8a26:
  pxVar7 = p_Var8->children;
  if (p_Var8->children != (_xmlNode *)0x0) goto LAB_001a89b8;
LAB_001a8b48:
  while( true ) {
    if (p_Var8->type == XML_ELEMENT_NODE) {
      if (p_Var8 != vctxt->inode->node) {
        pcVar5 = "xmlSchemaVDocWalk";
        pcVar4 = "element position mismatch";
        goto LAB_001a8c4d;
      }
      iVar1 = xmlSchemaValidatorPopElem(vctxt);
      if (iVar1 < 0) {
        pcVar5 = "xmlSchemaVDocWalk";
        pcVar4 = "calling xmlSchemaValidatorPopElem()";
        goto LAB_001a8c4d;
      }
      if (p_Var8 == pxVar3) goto LAB_001a8c55;
    }
LAB_001a8b75:
    pxVar7 = p_Var8->next;
    if (p_Var8->next != (_xmlNode *)0x0) break;
    p_Var8 = p_Var8->parent;
  }
  goto LAB_001a89b8;
}

Assistant:

static int
xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if (xmlSchemaPreRun(vctxt) < 0)
        return(-1);

    if (vctxt->doc != NULL) {
	/*
	 * Tree validation.
	 */
	ret = xmlSchemaVDocWalk(vctxt);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	/*
	 * XML Reader validation.
	 */
#ifdef XML_SCHEMA_READER_ENABLED
	ret = xmlSchemaVReaderWalk(vctxt);
#endif
#endif
    } else if ((vctxt->sax != NULL) && (vctxt->parserCtxt != NULL)) {
	/*
	 * SAX validation.
	 */
	ret = xmlParseDocument(vctxt->parserCtxt);
    } else {
	VERROR_INT("xmlSchemaVStart",
	    "no instance to validate");
	ret = -1;
    }

    xmlSchemaPostRun(vctxt);
    if (ret == 0)
	ret = vctxt->err;
    return (ret);
}